

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O3

int Acec_MatchBoxes(Acec_Box_t *pBox0,Acec_Box_t *pBox1)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  uint uVar10;
  Vec_Wec_t *pVVar11;
  long lVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t *p;
  Gia_Man_t *pTwo;
  Gia_Man_t *pOne;
  Vec_Int_t *p_00;
  uint *puVar16;
  Vec_Int_t *p_01;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  Vec_Int_t *vMap0;
  Acec_Box_t *local_60;
  Vec_Int_t *local_58;
  ulong local_50;
  Vec_Int_t *local_48;
  long local_40;
  Vec_Int_t *vMap1;
  
  pOne = pBox0->pGia;
  pTwo = pBox1->pGia;
  Acec_ComputeEquivClasses(pOne,pTwo,&vMap0,&vMap1);
  pVVar6 = vMap0;
  pVVar11 = pBox0->vLeafLits;
  if (0 < pVVar11->nSize) {
    lVar12 = 8;
    lVar18 = 0;
    do {
      pOne = *(Gia_Man_t **)((long)&pVVar11->pArray->nCap + lVar12);
      uVar14 = *(uint *)((long)pVVar11->pArray + lVar12 + -4);
      pTwo = (Gia_Man_t *)(ulong)uVar14;
      Acec_MatchBoxesSort((int *)pOne,uVar14,pVVar6->pArray);
      lVar18 = lVar18 + 1;
      pVVar11 = pBox0->vLeafLits;
      lVar12 = lVar12 + 0x10;
    } while (lVar18 < pVVar11->nSize);
  }
  pVVar5 = pBox1->vLeafLits;
  if (0 < pVVar5->nSize) {
    lVar12 = 8;
    lVar18 = 0;
    do {
      pOne = *(Gia_Man_t **)((long)&pVVar5->pArray->nCap + lVar12);
      uVar14 = *(uint *)((long)pVVar5->pArray + lVar12 + -4);
      pTwo = (Gia_Man_t *)(ulong)uVar14;
      Acec_MatchBoxesSort((int *)pOne,uVar14,vMap1->pArray);
      lVar18 = lVar18 + 1;
      pVVar5 = pBox1->vLeafLits;
      lVar12 = lVar12 + 0x10;
    } while (lVar18 < pVVar5->nSize);
    pVVar11 = pBox0->vLeafLits;
  }
  Acec_MatchCheckShift(pOne,pTwo,pVVar11,pVVar5,vMap0,vMap1,pBox0->vRootLits,pBox1->vRootLits);
  if (pBox0->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox0->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                  ,0x19e,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  if (pBox1->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox1->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                  ,0x19f,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  pVVar11 = pBox0->vLeafLits;
  iVar3 = pVVar11->nSize;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar4 = 8;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar5->pArray = pVVar6;
  pVVar5->nSize = iVar3;
  pBox0->vShared = pVVar5;
  pVVar5 = pBox1->vLeafLits;
  iVar3 = pVVar5->nSize;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar7->pArray = pVVar6;
  pVVar7->nSize = iVar3;
  pBox1->vShared = pVVar7;
  iVar3 = pVVar11->nSize;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar4 = 8;
  }
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar7->pArray = pVVar6;
  pVVar7->nSize = iVar3;
  pBox0->vUnique = pVVar7;
  iVar3 = pVVar5->nSize;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar7->pArray = pVVar6;
  pVVar7->nSize = iVar3;
  pBox1->vUnique = pVVar7;
  uVar14 = pVVar11->nSize;
  uVar17 = pVVar5->nSize;
  uVar9 = uVar14;
  if ((int)uVar17 <= (int)uVar14) {
    uVar9 = uVar17;
  }
  uVar15 = (ulong)uVar9;
  uVar19 = uVar15;
  if ((int)uVar17 < (int)uVar14) {
    do {
      if (((int)uVar9 < 0) || (pBox0->vUnique->nSize <= (int)uVar19)) goto LAB_0066bbd1;
      pVVar6 = pVVar11->pArray;
      if (0 < pVVar6[uVar19].nSize) {
        pVVar8 = pBox0->vUnique->pArray;
        lVar12 = 0;
        do {
          Vec_IntPush(pVVar8 + uVar19,pVVar6[uVar19].pArray[lVar12]);
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar6[uVar19].nSize);
        pVVar11 = pBox0->vLeafLits;
      }
      uVar19 = uVar19 + 1;
    } while ((int)uVar19 < pVVar11->nSize);
    pVVar5 = pBox1->vLeafLits;
    uVar17 = pVVar5->nSize;
  }
  uVar19 = uVar15;
  if ((int)uVar9 < (int)uVar17) {
    do {
      if (((int)uVar9 < 0) || (pBox1->vUnique->nSize <= (int)uVar19)) goto LAB_0066bbd1;
      pVVar6 = pVVar5->pArray;
      if (0 < pVVar6[uVar19].nSize) {
        pVVar8 = pBox1->vUnique->pArray;
        lVar12 = 0;
        do {
          Vec_IntPush(pVVar8 + uVar19,pVVar6[uVar19].pArray[lVar12]);
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar6[uVar19].nSize);
        pVVar5 = pBox1->vLeafLits;
      }
      uVar19 = uVar19 + 1;
    } while ((int)uVar19 < pVVar5->nSize);
  }
  if (0 < (int)uVar9) {
    uVar19 = 0;
    local_60 = pBox1;
    do {
      if ((((((long)pBox0->vShared->nSize <= (long)uVar19) ||
            ((long)local_60->vShared->nSize <= (long)uVar19)) ||
           ((long)pBox0->vUnique->nSize <= (long)uVar19)) ||
          (((long)local_60->vUnique->nSize <= (long)uVar19 ||
           ((long)pBox0->vLeafLits->nSize <= (long)uVar19)))) ||
         ((long)local_60->vLeafLits->nSize <= (long)uVar19)) {
LAB_0066bbd1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      local_40 = uVar19 * 0x10;
      pVVar6 = pBox0->vShared->pArray + uVar19;
      pVVar8 = local_60->vShared->pArray + uVar19;
      p = pBox0->vUnique->pArray + uVar19;
      p_01 = local_60->vUnique->pArray + uVar19;
      local_48 = pBox0->vLeafLits->pArray;
      local_58 = local_60->vLeafLits->pArray;
      puVar13 = (uint *)local_48[uVar19].pArray;
      puVar16 = (uint *)local_58[uVar19].pArray;
      puVar1 = puVar13 + local_48[uVar19].nSize;
      puVar2 = puVar16 + local_58[uVar19].nSize;
      local_50 = uVar19;
      if ((0 < (long)local_48[uVar19].nSize) && (0 < local_58[uVar19].nSize)) {
        do {
          uVar14 = *puVar13;
          if ((int)uVar14 < 0) {
LAB_0066bb74:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x135,"int Abc_Lit2LitL(int *, int)");
          }
          if (vMap0->pArray[uVar14 >> 1] < 0) {
LAB_0066bb93:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar17 = *puVar16;
          if ((int)uVar17 < 0) goto LAB_0066bb74;
          if (vMap1->pArray[uVar17 >> 1] < 0) goto LAB_0066bb93;
          if ((uVar14 == 0) || (uVar17 == 0)) {
            __assert_fail("*pBeg0 && *pBeg1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                          ,0x1ba,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
          }
          uVar9 = vMap0->pArray[uVar14 >> 1] ^ uVar14 & 1;
          uVar10 = vMap1->pArray[uVar17 >> 1] ^ uVar17 & 1;
          if (uVar9 == uVar10) {
            puVar13 = puVar13 + 1;
            Vec_IntPush(pVVar6,uVar14);
            uVar17 = *puVar16;
            puVar16 = puVar16 + 1;
            p_00 = pVVar8;
          }
          else if (uVar10 < uVar9) {
            puVar13 = puVar13 + 1;
            p_00 = p;
            uVar17 = uVar14;
          }
          else {
            puVar16 = puVar16 + 1;
            p_00 = p_01;
          }
          Vec_IntPush(p_00,uVar17);
        } while ((puVar13 < puVar1) && (puVar16 < puVar2));
      }
      for (; puVar13 < puVar1; puVar13 = puVar13 + 1) {
        Vec_IntPush(p,*puVar13);
      }
      for (; puVar16 < puVar2; puVar16 = puVar16 + 1) {
        Vec_IntPush(p_01,*puVar16);
      }
      iVar3 = pVVar6->nSize;
      if (iVar3 != pVVar8->nSize) {
        __assert_fail("Vec_IntSize(vShared0) == Vec_IntSize(vShared1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1c9,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      if (p->nSize + iVar3 != *(int *)((long)&local_48->nSize + local_40)) {
        __assert_fail("Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1ca,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      if (iVar3 + p_01->nSize != *(int *)((long)&local_58->nSize + local_40)) {
        __assert_fail("Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1cb,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      uVar19 = local_50 + 1;
      pBox1 = local_60;
    } while (uVar19 != uVar15);
  }
  lVar12 = (long)pBox0->vShared->nSize;
  uVar19 = 0;
  uVar14 = 0;
  if (0 < lVar12) {
    lVar18 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *(int *)((long)&pBox0->vShared->pArray->nSize + lVar18);
      lVar18 = lVar18 + 0x10;
    } while (lVar12 * 0x10 != lVar18);
  }
  lVar12 = (long)pBox0->vLeafLits->nSize;
  if (0 < lVar12) {
    lVar18 = 0;
    uVar19 = 0;
    do {
      uVar19 = (ulong)(uint)((int)uVar19 + *(int *)((long)&pBox0->vLeafLits->pArray->nSize + lVar18)
                            );
      lVar18 = lVar18 + 0x10;
    } while (lVar12 * 0x10 != lVar18);
  }
  uVar17 = 0;
  printf("Box0: Matched %d entries out of %d.\n",(ulong)uVar14,uVar19);
  lVar12 = (long)pBox1->vLeafLits->nSize;
  if (0 < lVar12) {
    lVar18 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + *(int *)((long)&pBox1->vLeafLits->pArray->nSize + lVar18);
      lVar18 = lVar18 + 0x10;
    } while (lVar12 * 0x10 != lVar18);
  }
  printf("Box1: Matched %d entries out of %d.\n",(ulong)uVar14,(ulong)uVar17);
  if (vMap0->pArray != (int *)0x0) {
    free(vMap0->pArray);
  }
  free(vMap0);
  if (vMap1->pArray != (int *)0x0) {
    free(vMap1->pArray);
  }
  free(vMap1);
  return uVar14;
}

Assistant:

int Acec_MatchBoxes( Acec_Box_t * pBox0, Acec_Box_t * pBox1 )
{
    Vec_Int_t * vMap0, * vMap1, * vLevel; 
    int i, nSize, nTotal;
    Acec_ComputeEquivClasses( pBox0->pGia, pBox1->pGia, &vMap0, &vMap1 );
    // sort nodes in the classes by their equivalences
    Vec_WecForEachLevel( pBox0->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap0) );
    Vec_WecForEachLevel( pBox1->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap1) );
    Acec_MatchCheckShift( pBox0->pGia, pBox1->pGia, pBox0->vLeafLits, pBox1->vLeafLits, vMap0, vMap1, pBox0->vRootLits, pBox1->vRootLits );
    
    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vLeafLits, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vLeafLits, Vec_IntArray(vMap1), 0 );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox0->vRootLits );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox1->vRootLits );

    // reorder nodes to have the same order
    assert( pBox0->vShared == NULL );
    assert( pBox1->vShared == NULL );
    pBox0->vShared = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vShared = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    pBox0->vUnique = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vUnique = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    nSize = Abc_MinInt( Vec_WecSize(pBox0->vLeafLits), Vec_WecSize(pBox1->vLeafLits) );
    Vec_WecForEachLevelStart( pBox0->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox0->vUnique, i), vLevel );
    Vec_WecForEachLevelStart( pBox1->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox1->vUnique, i), vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        Vec_Int_t * vShared0 = Vec_WecEntry( pBox0->vShared, i );
        Vec_Int_t * vShared1 = Vec_WecEntry( pBox1->vShared, i );
        Vec_Int_t * vUnique0 = Vec_WecEntry( pBox0->vUnique, i );
        Vec_Int_t * vUnique1 = Vec_WecEntry( pBox1->vUnique, i );

        Vec_Int_t * vLevel0 = Vec_WecEntry( pBox0->vLeafLits, i );
        Vec_Int_t * vLevel1 = Vec_WecEntry( pBox1->vLeafLits, i );
        int * pBeg0 = Vec_IntArray(vLevel0);
        int * pBeg1 = Vec_IntArray(vLevel1);
        int * pEnd0 = Vec_IntLimit(vLevel0);
        int * pEnd1 = Vec_IntLimit(vLevel1);
        while ( pBeg0 < pEnd0 && pBeg1 < pEnd1 )
        {
            int Entry0 = Abc_Lit2LitL( Vec_IntArray(vMap0), *pBeg0 );
            int Entry1 = Abc_Lit2LitL( Vec_IntArray(vMap1), *pBeg1 );
            assert( *pBeg0 && *pBeg1 );
            if ( Entry0 == Entry1 )
            {
                Vec_IntPush( vShared0, *pBeg0++ );
                Vec_IntPush( vShared1, *pBeg1++ );
            }
            else if ( Entry0 > Entry1 )
                Vec_IntPush( vUnique0, *pBeg0++ );
            else 
                Vec_IntPush( vUnique1, *pBeg1++ );
        }
        while ( pBeg0 < pEnd0 )
            Vec_IntPush( vUnique0, *pBeg0++ );
        while ( pBeg1 < pEnd1 )
            Vec_IntPush( vUnique1, *pBeg1++ );
        assert( Vec_IntSize(vShared0) == Vec_IntSize(vShared1) );
        assert( Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0) );
        assert( Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1) );
    }
    nTotal = Vec_WecSizeSize(pBox0->vShared);
    printf( "Box0: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox0->vLeafLits) );
    printf( "Box1: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox1->vLeafLits) );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vShared, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vShared, Vec_IntArray(vMap1), 0 );
    //printf( "\n" );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vUnique, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vUnique, Vec_IntArray(vMap1), 0 );

    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return nTotal;
}